

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::value::color4f>::TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::value::color4f> *this,
          TypedAttributeWithFallback<tinyusdz::value::color4f> *param_1)

{
  bool bVar1;
  pointer pPVar2;
  undefined8 uVar3;
  undefined3 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  AttrMetas::AttrMetas(&this->_metas,&param_1->_metas);
  pPVar2 = (param_1->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = pPVar2;
  (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (param_1->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = (param_1->_attrib).has_value_;
  (this->_attrib).has_value_ = bVar1;
  if (bVar1 == true) {
    uVar3 = *(undefined8 *)((long)&(param_1->_attrib).contained + 8);
    *(undefined8 *)&(this->_attrib).contained = *(undefined8 *)&(param_1->_attrib).contained;
    *(undefined8 *)((long)&(this->_attrib).contained + 8) = uVar3;
  }
  *(undefined8 *)((long)&(this->_fallback).b + 1) =
       *(undefined8 *)((long)&(param_1->_fallback).b + 1);
  uVar4 = *(undefined3 *)&param_1->field_0x235;
  fVar5 = (param_1->_fallback).r;
  fVar6 = (param_1->_fallback).g;
  fVar7 = (param_1->_fallback).b;
  this->_empty = param_1->_empty;
  *(undefined3 *)&this->field_0x235 = uVar4;
  (this->_fallback).r = fVar5;
  (this->_fallback).g = fVar6;
  (this->_fallback).b = fVar7;
  return;
}

Assistant:

static uint32_t type_id() { return value::TypeTraits<T>::type_id(); }